

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

int CostModelBuild(CostModel *m,int xsize,int cache_bits,VP8LBackwardRefs *refs)

{
  int iVar1;
  VP8LHistogram *p;
  VP8LBackwardRefs *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  PixOrCopy *in_RDI;
  VP8LHistogram *unaff_retaddr;
  VP8LHistogram *histo;
  VP8LRefsCursor c;
  int ok;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffcc;
  PixOrCopyBlock *in_stack_ffffffffffffffd0;
  PixOrCopy *in_stack_ffffffffffffffd8;
  int num_symbols;
  
  num_symbols = 0;
  VP8LRefsCursorInit((VP8LRefsCursor *)&stack0xffffffffffffffc8,in_RCX);
  p = VP8LAllocateHistogram(in_stack_ffffffffffffffcc);
  if (p != (VP8LHistogram *)0x0) {
    VP8LHistogramInit(p,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    while (iVar1 = VP8LRefsCursorOk((VP8LRefsCursor *)&stack0xffffffffffffffc8), iVar1 != 0) {
      VP8LHistogramAddSinglePixOrCopy
                (unaff_retaddr,in_RDI,(_func_int_int_int *)CONCAT44(in_ESI,in_EDX),
                 (int)((ulong)in_RCX >> 0x20));
      VP8LRefsCursorNext((VP8LRefsCursor *)0x1a1dfe);
    }
    VP8LHistogramNumCodes(p->palette_code_bits_);
    ConvertPopulationCountTableToBitEstimates
              (num_symbols,(uint32_t *)in_stack_ffffffffffffffd8,(double *)in_stack_ffffffffffffffd0
              );
    ConvertPopulationCountTableToBitEstimates
              (num_symbols,(uint32_t *)in_stack_ffffffffffffffd8,(double *)in_stack_ffffffffffffffd0
              );
    ConvertPopulationCountTableToBitEstimates
              (num_symbols,(uint32_t *)in_stack_ffffffffffffffd8,(double *)in_stack_ffffffffffffffd0
              );
    ConvertPopulationCountTableToBitEstimates
              (num_symbols,(uint32_t *)in_stack_ffffffffffffffd8,(double *)in_stack_ffffffffffffffd0
              );
    ConvertPopulationCountTableToBitEstimates
              (num_symbols,(uint32_t *)in_stack_ffffffffffffffd8,(double *)in_stack_ffffffffffffffd0
              );
    num_symbols = 1;
  }
  VP8LFreeHistogram((VP8LHistogram *)0x1a1ebb);
  return num_symbols;
}

Assistant:

static int CostModelBuild(CostModel* const m, int xsize, int cache_bits,
                          const VP8LBackwardRefs* const refs) {
  int ok = 0;
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  VP8LHistogram* const histo = VP8LAllocateHistogram(cache_bits);
  if (histo == NULL) goto Error;

  // The following code is similar to VP8LHistogramCreate but converts the
  // distance to plane code.
  VP8LHistogramInit(histo, cache_bits, /*init_arrays=*/ 1);
  while (VP8LRefsCursorOk(&c)) {
    VP8LHistogramAddSinglePixOrCopy(histo, c.cur_pos, VP8LDistanceToPlaneCode,
                                    xsize);
    VP8LRefsCursorNext(&c);
  }

  ConvertPopulationCountTableToBitEstimates(
      VP8LHistogramNumCodes(histo->palette_code_bits_),
      histo->literal_, m->literal_);
  ConvertPopulationCountTableToBitEstimates(
      VALUES_IN_BYTE, histo->red_, m->red_);
  ConvertPopulationCountTableToBitEstimates(
      VALUES_IN_BYTE, histo->blue_, m->blue_);
  ConvertPopulationCountTableToBitEstimates(
      VALUES_IN_BYTE, histo->alpha_, m->alpha_);
  ConvertPopulationCountTableToBitEstimates(
      NUM_DISTANCE_CODES, histo->distance_, m->distance_);
  ok = 1;

 Error:
  VP8LFreeHistogram(histo);
  return ok;
}